

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::(anonymous_namespace)::CWriter::Write<char_const(&)[58],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [58],Newline *u)

{
  size_t size;
  
  size = strlen(*t);
  anon_unknown_0::CWriter::WriteData((CWriter *)this,*t,size);
  if (*(int *)(this + 0x94) < 2) {
    anon_unknown_0::CWriter::WriteData((CWriter *)this,"\n",1);
    *(int *)(this + 0x94) = *(int *)(this + 0x94) + 1;
  }
  this[0x90] = (CWriter)0x1;
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }